

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  Type *pTVar4;
  pointer piVar5;
  ulong uVar6;
  
  pTVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
                     (&(this->annotation_proto_->annotation_).super_RepeatedPtrFieldBase,(Type *)0x0
                     );
  piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    uVar6 = 0;
    do {
      iVar1 = piVar5[uVar6];
      iVar2 = (pTVar4->path_).total_size_;
      if ((pTVar4->path_).current_size_ == iVar2) {
        RepeatedField<int>::Reserve(&pTVar4->path_,iVar2 + 1);
      }
      iVar2 = (pTVar4->path_).current_size_;
      (pTVar4->path_).current_size_ = iVar2 + 1;
      ((pTVar4->path_).rep_)->elements[iVar2] = iVar1;
      uVar6 = uVar6 + 1;
      piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    } while (uVar6 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  *(byte *)(pTVar4->_has_bits_).has_bits_ = (byte)(pTVar4->_has_bits_).has_bits_[0] | 1;
  psVar3 = (pTVar4->source_file_).ptr_;
  if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar4->source_file_,file_path);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  pTVar4->begin_ = (int32)begin_offset;
  *(byte *)(pTVar4->_has_bits_).has_bits_ = (byte)(pTVar4->_has_bits_).has_bits_[0] | 6;
  pTVar4->end_ = (int32)end_offset;
  return;
}

Assistant:

virtual void AddAnnotation(size_t begin_offset, size_t end_offset,
                             const string& file_path,
                             const std::vector<int>& path) {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }